

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O1

int x509_crt_verify_restartable_ca_cb
              (mbedtls_x509_crt *crt,mbedtls_x509_crt *trust_ca,mbedtls_x509_crl *ca_crl,
              mbedtls_x509_crt_ca_cb_t f_ca_cb,void *p_ca_cb,mbedtls_x509_crt_profile *profile,
              char *cn,uint32_t *flags,
              _func_int_void_ptr_mbedtls_x509_crt_ptr_int_uint32_t_ptr *f_vrfy,void *p_vrfy,
              mbedtls_x509_crt_restart_ctx *rs_ctx)

{
  byte *pbVar1;
  short *psVar2;
  uint uVar3;
  bool bVar4;
  uint32_t uVar5;
  byte bVar6;
  int iVar7;
  uint uVar8;
  mbedtls_pk_type_t mVar9;
  long lVar10;
  size_t sVar11;
  size_t __n;
  mbedtls_md_info_t *md_info;
  int iVar12;
  mbedtls_x509_crt *pmVar13;
  ulong uVar14;
  mbedtls_asn1_named_data *pmVar15;
  mbedtls_x509_crt_verify_chain_item *pmVar16;
  mbedtls_x509_sequence *cur;
  mbedtls_x509_buf *name;
  mbedtls_x509_sequence *cur_2;
  mbedtls_asn1_sequence *pmVar17;
  mbedtls_x509_sequence *cur_1;
  mbedtls_asn1_sequence *pmVar18;
  bool bVar19;
  bool bVar20;
  undefined8 uStack_148;
  mbedtls_x509_crt *local_140;
  mbedtls_x509_crt_verify_chain ver_chain;
  uint32_t ip [4];
  int local_54;
  uint32_t local_48;
  mbedtls_x509_crt_verify_chain *local_38;
  
  *(undefined4 *)p_ca_cb = 0;
  lVar10 = 8;
  do {
    *(undefined8 *)((long)&uStack_148 + lVar10) = 0;
    *(undefined4 *)((long)ver_chain.items + lVar10 + -8) = 0xffffffff;
    lVar10 = lVar10 + 0x10;
  } while (lVar10 != 0xa8);
  ver_chain.items[9].flags = 0;
  if (ca_crl == (mbedtls_x509_crl *)0x0) {
    iVar7 = -0x2800;
    goto LAB_0021df5d;
  }
  uVar8 = 0;
  if (f_ca_cb == (mbedtls_x509_crt_ca_cb_t)0x0) {
LAB_0021db7e:
    uVar8 = 0;
  }
  else {
    sVar11 = strlen((char *)f_ca_cb);
    if ((crt->ext_types & 0x20) == 0) {
      pmVar15 = &crt->subject;
      do {
        if ((((pmVar15->oid).len == 3) &&
            (psVar2 = (short *)(pmVar15->oid).p, (char)psVar2[1] == '\x03' && *psVar2 == 0x455)) &&
           (iVar7 = x509_crt_check_cn(&pmVar15->val,(char *)f_ca_cb,sVar11), iVar7 == 0))
        goto LAB_0021db82;
        pmVar15 = pmVar15->next;
      } while (pmVar15 != (mbedtls_asn1_named_data *)0x0);
    }
    else {
      pmVar17 = &crt->subject_alt_names;
      bVar20 = false;
      bVar19 = false;
      name = &pmVar17->buf;
      do {
        uVar8 = name->tag & 0x1f;
        if (uVar8 == 7) {
          bVar19 = true;
        }
        else if (uVar8 == 6) {
          bVar20 = true;
        }
        else if ((uVar8 == 2) &&
                (iVar7 = x509_crt_check_cn(name,(char *)f_ca_cb,sVar11), iVar7 == 0))
        goto LAB_0021db7e;
        name = *(mbedtls_x509_buf **)(name + 1);
      } while (name != (mbedtls_x509_buf *)0x0);
      if ((bVar19) &&
         (__n = mbedtls_x509_crt_parse_cn_inet_pton((char *)f_ca_cb,&ver_chain.len), __n != 0)) {
        bVar19 = false;
        pmVar18 = pmVar17;
        do {
          if (((((pmVar18->buf).tag & 0x1fU) == 7) && ((pmVar18->buf).len == __n)) &&
             (iVar7 = bcmp((pmVar18->buf).p,&ver_chain.len,__n), iVar7 == 0)) break;
          pmVar18 = pmVar18->next;
          bVar19 = pmVar18 == (mbedtls_asn1_sequence *)0x0;
        } while (!bVar19);
        if (!bVar19) goto LAB_0021db7e;
      }
      if (bVar20) {
        bVar19 = false;
        do {
          if (((((pmVar17->buf).tag & 0x1fU) == 6) && ((pmVar17->buf).len == sVar11)) &&
             (iVar7 = bcmp((pmVar17->buf).p,f_ca_cb,sVar11), iVar7 == 0)) break;
          pmVar17 = pmVar17->next;
          bVar19 = pmVar17 == (mbedtls_asn1_sequence *)0x0;
        } while (!bVar19);
        if (!bVar19) {
          uVar8 = 0;
          goto LAB_0021db82;
        }
      }
    }
    uVar8 = 4;
  }
LAB_0021db82:
  mVar9 = mbedtls_pk_get_type(&crt->pk);
  uVar14 = 0;
  if (mVar9 == MBEDTLS_PK_NONE) {
    bVar19 = false;
  }
  else {
    bVar19 = (*(uint *)&(ca_crl->raw).field_0x4 >> ((byte)((char)mVar9 - 1) & 0x1f) & 1) != 0;
  }
  uVar3 = uVar8 + 0x8000;
  if (bVar19) {
    uVar3 = uVar8;
  }
  iVar7 = x509_profile_check_key((mbedtls_x509_crt_profile *)ca_crl,&crt->pk);
  uVar8 = uVar3 + 0x10000;
  if (iVar7 == 0) {
    uVar8 = uVar3;
  }
  local_38 = &ver_chain;
  local_140 = crt;
  ver_chain.items[0].crt._0_4_ = 0;
  ver_chain.items[9].flags = 1;
  local_48 = 1;
  local_54 = 0;
  do {
    ver_chain.items[9].flags = local_48;
    if ((crt->sig_md == MBEDTLS_MD_NONE) ||
       (((uint)(ca_crl->raw).tag >> ((byte)((char)crt->sig_md - 1) & 0x1f) & 1) == 0)) {
      *(undefined4 *)&local_38->items[0].crt = 0x4000;
    }
    if ((crt->sig_pk == MBEDTLS_PK_NONE) ||
       ((*(uint *)&(ca_crl->raw).field_0x4 >> ((byte)((char)crt->sig_pk - 1) & 0x1f) & 1) == 0)) {
      pbVar1 = (byte *)((long)&local_38->items[0].crt + 1);
      *pbVar1 = *pbVar1 | 0x80;
    }
    if ((((int)uVar14 == 0) && (iVar7 = x509_name_cmp(&crt->issuer,&crt->subject), iVar7 == 0)) &&
       (trust_ca != (mbedtls_x509_crt *)0x0)) {
      sVar11 = (crt->raw).len;
      pmVar13 = trust_ca;
      do {
        if ((sVar11 == (pmVar13->raw).len) &&
           (iVar7 = bcmp((crt->raw).p,(pmVar13->raw).p,sVar11), iVar7 == 0)) goto LAB_0021dec4;
        pmVar13 = pmVar13->next;
      } while (pmVar13 != (mbedtls_x509_crt *)0x0);
    }
    bVar19 = false;
    pmVar13 = trust_ca;
joined_r0x0021dc8d:
    for (; pmVar13 != (mbedtls_x509_crt *)0x0; pmVar13 = pmVar13->next) {
      iVar7 = x509_name_cmp(&crt->issuer,&pmVar13->subject);
      if (iVar7 == 0) {
        if (bVar19) {
          bVar20 = false;
        }
        else {
          bVar20 = pmVar13->version < 3;
        }
        if (((bVar20) ||
            ((pmVar13->ca_istrue != 0 &&
             (((pmVar13->ext_types & 4) == 0 || ((pmVar13->key_usage & 0x8005) == 4)))))) &&
           ((pmVar13->max_pathlen < 1 || (local_48 - local_54 <= (uint)pmVar13->max_pathlen)))) {
          md_info = mbedtls_md_info_from_type(crt->sig_md);
          bVar6 = mbedtls_md_get_size(md_info);
          iVar7 = mbedtls_md(md_info,(crt->tbs).p,(crt->tbs).len,(uchar *)&ver_chain.len);
          if (iVar7 == 0) {
            iVar7 = mbedtls_pk_can_do(&pmVar13->pk,crt->sig_pk);
            if (iVar7 == 0) goto LAB_0021dd3e;
            iVar7 = mbedtls_pk_verify_ext
                              (crt->sig_pk,crt->sig_opts,&pmVar13->pk,crt->sig_md,
                               (uchar *)&ver_chain.len,(ulong)bVar6,(crt->sig).p,(crt->sig).len);
            bVar20 = iVar7 == 0;
          }
          else {
LAB_0021dd3e:
            bVar20 = false;
          }
          if ((bool)(bVar19 | bVar20)) goto LAB_0021ddb5;
        }
      }
    }
    pmVar13 = (mbedtls_x509_crt *)0x0;
    bVar20 = false;
LAB_0021ddb5:
    uVar5 = ver_chain.items[9].flags;
    if (pmVar13 == (mbedtls_x509_crt *)0x0 && !bVar19) {
      pmVar13 = crt->next;
      bVar19 = true;
      goto joined_r0x0021dc8d;
    }
    if (pmVar13 == (mbedtls_x509_crt *)0x0) {
      *(byte *)&local_38->items[0].crt = *(byte *)&local_38->items[0].crt | 8;
LAB_0021dec4:
      iVar7 = 0;
      bVar4 = true;
      goto LAB_0021dedb;
    }
    if (ver_chain.items[9].flags != 1) {
      iVar7 = x509_name_cmp(&crt->issuer,&crt->subject);
      local_54 = local_54 + (uint)(iVar7 == 0);
    }
    bVar4 = (bool)(8 < uVar5 & (bVar19 | pmVar13 == (mbedtls_x509_crt *)0x0));
    if (bVar4) {
      iVar7 = -0x3000;
      goto LAB_0021ded7;
    }
    if (!bVar20) {
      *(byte *)&local_38->items[0].crt = *(byte *)&local_38->items[0].crt | 8;
    }
    iVar7 = x509_profile_check_key((mbedtls_x509_crt_profile *)ca_crl,&pmVar13->pk);
    if (iVar7 != 0) {
      pbVar1 = (byte *)((long)&local_38->items[0].crt + 2);
      *pbVar1 = *pbVar1 | 1;
    }
    uVar14 = (ulong)ver_chain.items[9].flags;
    local_38 = (mbedtls_x509_crt_verify_chain *)(ver_chain.items + uVar14);
    *(mbedtls_x509_crt **)&ver_chain.items[uVar14 - 1].flags = pmVar13;
    *(undefined4 *)&local_38->items[0].crt = 0;
    local_48 = ver_chain.items[9].flags + 1;
    ver_chain.items[9].flags = local_48;
    crt = pmVar13;
  } while (bVar19 || pmVar13 == (mbedtls_x509_crt *)0x0);
  iVar7 = 0;
LAB_0021ded7:
  bVar4 = (bool)(bVar4 ^ 1);
LAB_0021dedb:
  if (bVar4) {
    ver_chain.items[0].crt._0_4_ = (uint)ver_chain.items[0].crt | uVar8;
    iVar7 = 0;
    if (ver_chain.items[9].flags != 0) {
      uVar14 = (ulong)(ver_chain.items[9].flags - 1);
      pmVar16 = ver_chain.items + uVar14;
      do {
        ver_chain.len = *(uint *)&pmVar16->crt;
        iVar12 = (int)uVar14;
        if ((profile != (mbedtls_x509_crt_profile *)0x0) &&
           (iVar7 = (*(code *)profile)(cn,*(undefined8 *)((long)(pmVar16 + -1) + 8),uVar14,
                                       &ver_chain.len), iVar7 != 0)) break;
        *(uint *)p_ca_cb = *p_ca_cb | ver_chain.len;
        pmVar16 = pmVar16 + -1;
        uVar14 = (ulong)(iVar12 - 1);
        iVar7 = 0;
      } while (iVar12 != 0);
    }
  }
LAB_0021df5d:
  iVar12 = -0x3000;
  if (iVar7 != -0x2700) {
    iVar12 = iVar7;
  }
  if (iVar12 == 0) {
    iVar12 = -0x2700;
    if (*p_ca_cb == 0) {
      iVar12 = 0;
    }
  }
  else {
    *(undefined4 *)p_ca_cb = 0xffffffff;
  }
  return iVar12;
}

Assistant:

static int x509_crt_verify_restartable_ca_cb(mbedtls_x509_crt *crt,
                                             mbedtls_x509_crt *trust_ca,
                                             mbedtls_x509_crl *ca_crl,
                                             mbedtls_x509_crt_ca_cb_t f_ca_cb,
                                             void *p_ca_cb,
                                             const mbedtls_x509_crt_profile *profile,
                                             const char *cn, uint32_t *flags,
                                             int (*f_vrfy)(void *,
                                                           mbedtls_x509_crt *,
                                                           int,
                                                           uint32_t *),
                                             void *p_vrfy,
                                             mbedtls_x509_crt_restart_ctx *rs_ctx)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_pk_type_t pk_type;
    mbedtls_x509_crt_verify_chain ver_chain;
    uint32_t ee_flags;

    *flags = 0;
    ee_flags = 0;
    x509_crt_verify_chain_reset(&ver_chain);

    if (profile == NULL) {
        ret = MBEDTLS_ERR_X509_BAD_INPUT_DATA;
        goto exit;
    }

    /* check name if requested */
    if (cn != NULL) {
        x509_crt_verify_name(crt, cn, &ee_flags);
    }

    /* Check the type and size of the key */
    pk_type = mbedtls_pk_get_type(&crt->pk);

    if (x509_profile_check_pk_alg(profile, pk_type) != 0) {
        ee_flags |= MBEDTLS_X509_BADCERT_BAD_PK;
    }

    if (x509_profile_check_key(profile, &crt->pk) != 0) {
        ee_flags |= MBEDTLS_X509_BADCERT_BAD_KEY;
    }

    /* Check the chain */
    ret = x509_crt_verify_chain(crt, trust_ca, ca_crl,
                                f_ca_cb, p_ca_cb, profile,
                                &ver_chain, rs_ctx);

    if (ret != 0) {
        goto exit;
    }

    /* Merge end-entity flags */
    ver_chain.items[0].flags |= ee_flags;

    /* Build final flags, calling callback on the way if any */
    ret = x509_crt_merge_flags_with_cb(flags, &ver_chain, f_vrfy, p_vrfy);

exit:

#if defined(MBEDTLS_X509_TRUSTED_CERTIFICATE_CALLBACK)
    mbedtls_x509_crt_free(ver_chain.trust_ca_cb_result);
    mbedtls_free(ver_chain.trust_ca_cb_result);
    ver_chain.trust_ca_cb_result = NULL;
#endif /* MBEDTLS_X509_TRUSTED_CERTIFICATE_CALLBACK */

#if defined(MBEDTLS_ECDSA_C) && defined(MBEDTLS_ECP_RESTARTABLE)
    if (rs_ctx != NULL && ret != MBEDTLS_ERR_ECP_IN_PROGRESS) {
        mbedtls_x509_crt_restart_free(rs_ctx);
    }
#endif

    /* prevent misuse of the vrfy callback - VERIFY_FAILED would be ignored by
     * the SSL module for authmode optional, but non-zero return from the
     * callback means a fatal error so it shouldn't be ignored */
    if (ret == MBEDTLS_ERR_X509_CERT_VERIFY_FAILED) {
        ret = MBEDTLS_ERR_X509_FATAL_ERROR;
    }

    if (ret != 0) {
        *flags = (uint32_t) -1;
        return ret;
    }

    if (*flags != 0) {
        return MBEDTLS_ERR_X509_CERT_VERIFY_FAILED;
    }

    return 0;
}